

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

int __thiscall crnd::prefix_coding::decoder_tables::init(decoder_tables *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ushort uVar2;
  uint16 *puVar3;
  uint uVar4;
  uint32 i;
  uint32 uVar5;
  ulong uVar6;
  uint *puVar7;
  uint32 *puVar8;
  byte bVar9;
  byte bVar10;
  uint in_ECX;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  long in_RDX;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint32 num_codes [17];
  uint32 min_codes [16];
  uint32 sorted_positions [17];
  int local_108 [19];
  uint auStack_bc [17];
  uint auStack_78 [18];
  
  uVar16 = (uint)ctx;
  if (0xb < in_ECX || uVar16 == 0) {
    return 0;
  }
  this->m_num_syms = uVar16;
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0x10] = 0;
  uVar6 = 0;
  do {
    if ((ulong)*(byte *)(in_RDX + uVar6) != 0) {
      local_108[*(byte *)(in_RDX + uVar6)] = local_108[*(byte *)(in_RDX + uVar6)] + 1;
    }
    uVar6 = uVar6 + 1;
  } while (((ulong)ctx & 0xffffffff) != uVar6);
  uVar12 = 0xffffffff;
  lVar14 = 0;
  bVar9 = 0xf;
  uVar11 = 0;
  uVar17 = 0;
  uVar19 = 0;
  do {
    iVar20 = local_108[lVar14 + 1];
    if (iVar20 == 0) {
      this->m_max_codes[lVar14] = 0;
    }
    else {
      uVar18 = (int)lVar14 + 1;
      if (uVar18 <= uVar12) {
        uVar12 = uVar18;
      }
      if (uVar19 <= uVar18) {
        uVar19 = uVar18;
      }
      iVar1 = iVar20 + uVar11;
      auStack_bc[lVar14 + 1] = uVar11;
      uVar11 = iVar20 + uVar11;
      this->m_max_codes[lVar14] = (~(-1 << (bVar9 & 0x1f)) | iVar1 + -1 << (bVar9 & 0x1f)) + 1;
      this->m_val_ptrs[lVar14] = uVar17;
      auStack_78[lVar14 + 1] = uVar17;
      uVar17 = iVar20 + uVar17;
    }
    uVar11 = uVar11 * 2;
    bVar9 = bVar9 - 1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  this->m_total_used_syms = uVar17;
  if (this->m_cur_sorted_symbol_order_size < uVar17) {
    uVar11 = uVar17 - 1;
    if (((uVar17 & uVar11) != 0) &&
       (uVar11 = uVar11 >> 0x10 | uVar11, uVar11 = uVar11 >> 8 | uVar11,
       uVar11 = uVar11 >> 4 | uVar11, uVar11 = uVar11 >> 2 | uVar11,
       uVar17 = (uVar11 >> 1 | uVar11) + 1, uVar16 < uVar17)) {
      uVar17 = uVar16;
    }
    this->m_cur_sorted_symbol_order_size = uVar17;
    if (this->m_sorted_symbol_order != (uint16 *)0x0) {
      crnd_free(this->m_sorted_symbol_order + -4);
    }
    uVar11 = this->m_cur_sorted_symbol_order_size +
             (uint)(this->m_cur_sorted_symbol_order_size == 0);
    puVar7 = (uint *)crnd_malloc((ulong)uVar11 * 2 + 8,(size_t *)0x0);
    puVar13 = (uint *)0x0;
    if (puVar7 != (uint *)0x0) {
      puVar13 = puVar7 + 2;
      puVar7[1] = uVar11;
      *puVar7 = ~uVar11;
    }
    this->m_sorted_symbol_order = (uint16 *)puVar13;
    if (puVar13 == (uint *)0x0) {
      return 0;
    }
  }
  this->m_min_code_size = (uint8)uVar12;
  this->m_max_code_size = (uint8)uVar19;
  if (uVar16 != 0) {
    puVar3 = this->m_sorted_symbol_order;
    uVar6 = 0;
    do {
      uVar15 = (ulong)*(byte *)(in_RDX + uVar6);
      if (uVar15 != 0) {
        uVar16 = auStack_78[uVar15];
        auStack_78[uVar15] = uVar16 + 1;
        puVar3[uVar16] = (uint16)uVar6;
      }
      uVar6 = uVar6 + 1;
    } while (((ulong)ctx & 0xffffffff) != uVar6);
  }
  uVar12 = uVar12 & 0xff;
  uVar16 = 0;
  if (uVar12 < in_ECX) {
    uVar16 = in_ECX;
  }
  this->m_table_bits = uVar16;
  if (uVar12 < in_ECX) {
    bVar9 = (byte)uVar16;
    uVar11 = 1 << (bVar9 & 0x1f);
    if (this->m_cur_lookup_size < uVar11) {
      this->m_cur_lookup_size = uVar11;
      if (this->m_lookup != (uint32 *)0x0) {
        crnd_free(this->m_lookup + -2);
      }
      puVar8 = (uint32 *)0x0;
      puVar7 = (uint *)crnd_malloc((ulong)((4 << (bVar9 & 0x1f)) + 8),(size_t *)0x0);
      if (puVar7 != (uint *)0x0) {
        puVar8 = puVar7 + 2;
        puVar7[1] = uVar11;
        *puVar7 = ~uVar11;
      }
      this->m_lookup = puVar8;
      if (puVar8 == (uint32 *)0x0) {
        return 0;
      }
    }
    memset(this->m_lookup,0xff,4L << (bVar9 & 0x3f));
    if (uVar12 < in_ECX) {
      puVar8 = this->m_lookup;
      puVar3 = this->m_sorted_symbol_order;
      uVar6 = 1;
      do {
        if (local_108[uVar6] != 0) {
          uVar5 = this->m_max_codes[uVar6 - 1];
          uVar17 = uVar5 - 1 >> (0x10U - (char)uVar6 & 0x1f);
          uVar11 = auStack_bc[uVar6];
          if ((uVar5 == 0) || (uVar11 <= uVar17)) {
            bVar10 = bVar9 - (char)uVar6;
            iVar20 = this->m_max_codes[uVar6 + 0x10] - uVar11;
            do {
              uVar2 = puVar3[iVar20 + uVar11];
              uVar18 = 1;
              do {
                puVar8[((uVar11 << (bVar10 & 0x1f)) + uVar18) - 1] =
                     (uint)uVar2 | (int)uVar6 << 0x10;
                uVar4 = uVar18 >> (bVar10 & 0x1f);
                uVar18 = uVar18 + 1;
              } while (uVar4 == 0);
              uVar11 = uVar11 + 1;
            } while ((uVar5 == 0) || (uVar11 <= uVar17));
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar16 + 1 + (uint)(uVar16 == 0));
    }
  }
  lVar14 = 0;
  do {
    this->m_val_ptrs[lVar14] = this->m_val_ptrs[lVar14] - auStack_bc[lVar14 + 1];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  this->m_table_max_code = 0;
  this->m_decode_start_code_size = (uint)this->m_min_code_size;
  if (uVar12 < in_ECX) {
    puVar8 = this->m_max_codes + (uVar16 - 1);
    uVar11 = uVar16;
    do {
      if (local_108[uVar11] != 0) {
        this->m_table_max_code = *puVar8;
        uVar11 = uVar16 + 1;
        this->m_decode_start_code_size = uVar11;
        if (uVar16 < uVar19) goto LAB_0011100c;
        break;
      }
      puVar8 = puVar8 + -1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  goto LAB_00111020;
  while (uVar11 = uVar11 + 1, uVar11 <= uVar19) {
LAB_0011100c:
    if (local_108[uVar11] != 0) {
      this->m_decode_start_code_size = uVar11;
      break;
    }
  }
LAB_00111020:
  this->m_max_codes[0x10] = 0xffffffff;
  this->m_val_ptrs[0x10] = 0xfffff;
  uVar5 = 0x20 - this->m_table_bits;
  this->m_table_shift = uVar5;
  return (int)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
}

Assistant:

bool decoder_tables::init(uint32 num_syms, const uint8* pCodesizes, uint32 table_bits)
        {
            uint32 min_codes[cMaxExpectedCodeSize];
            if ((!num_syms) || (table_bits > cMaxTableBits))
                return false;

            m_num_syms = num_syms;

            uint32 num_codes[cMaxExpectedCodeSize + 1];
            utils::zero_object(num_codes);

            for (uint32 i = 0; i < num_syms; i++)
            {
                uint32 c = pCodesizes[i];
                if (c)
                    num_codes[c]++;
            }

            uint32 sorted_positions[cMaxExpectedCodeSize + 1];

            uint32 cur_code = 0;

            uint32 total_used_syms = 0;
            uint32 max_code_size = 0;
            uint32 min_code_size = cUINT32_MAX;
            for (uint32 i = 1; i <= cMaxExpectedCodeSize; i++)
            {
                const uint32 n = num_codes[i];

                if (!n)
                    m_max_codes[i - 1] = 0; //UINT_MAX;
                else
                {
                    min_code_size = math::minimum(min_code_size, i);
                    max_code_size = math::maximum(max_code_size, i);

                    min_codes[i - 1] = cur_code;

                    m_max_codes[i - 1] = cur_code + n - 1;
                    m_max_codes[i - 1] = 1 + ((m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

                    m_val_ptrs[i - 1] = total_used_syms;

                    sorted_positions[i] = total_used_syms;

                    cur_code += n;
                    total_used_syms += n;
                }

                cur_code <<= 1;
            }

            m_total_used_syms = total_used_syms;

            if (total_used_syms > m_cur_sorted_symbol_order_size)
            {
                m_cur_sorted_symbol_order_size = total_used_syms;

                if (!math::is_power_of_2(total_used_syms))
                    m_cur_sorted_symbol_order_size = math::minimum<uint32>(num_syms, math::next_pow2(total_used_syms));

                if (m_sorted_symbol_order)
                    crnd_delete_array(m_sorted_symbol_order);

                m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
                if (!m_sorted_symbol_order)
                    return false;
            }

            m_min_code_size = static_cast<uint8>(min_code_size);
            m_max_code_size = static_cast<uint8>(max_code_size);

            for (uint32 i = 0; i < num_syms; i++)
            {
                uint32 c = pCodesizes[i];
                if (c)
                {
                    CRND_ASSERT(num_codes[c]);

                    uint32 sorted_pos = sorted_positions[c]++;

                    CRND_ASSERT(sorted_pos < total_used_syms);

                    m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
                }
            }

            if (table_bits <= m_min_code_size)
                table_bits = 0;
            m_table_bits = table_bits;

            if (table_bits)
            {
                uint32 table_size = 1 << table_bits;
                if (table_size > m_cur_lookup_size)
                {
                    m_cur_lookup_size = table_size;

                    if (m_lookup)
                        crnd_delete_array(m_lookup);

                    m_lookup = crnd_new_array<uint32>(table_size);
                    if (!m_lookup)
                        return false;
                }

                memset(m_lookup, 0xFF, (uint)sizeof(m_lookup[0]) * (1UL << table_bits));

                for (uint32 codesize = 1; codesize <= table_bits; codesize++)
                {
                    if (!num_codes[codesize])
                        continue;

                    const uint32 fillsize = table_bits - codesize;
                    const uint32 fillnum = 1 << fillsize;

                    const uint32 min_code = min_codes[codesize - 1];
                    const uint32 max_code = get_unshifted_max_code(codesize);
                    const uint32 val_ptr = m_val_ptrs[codesize - 1];

                    for (uint32 code = min_code; code <= max_code; code++)
                    {
                        const uint32 sym_index = m_sorted_symbol_order[val_ptr + code - min_code];
                        CRND_ASSERT(pCodesizes[sym_index] == codesize);

                        for (uint32 j = 0; j < fillnum; j++)
                        {
                            const uint32 t = j + (code << fillsize);

                            CRND_ASSERT(t < (1U << table_bits));

                            CRND_ASSERT(m_lookup[t] == cUINT32_MAX);

                            m_lookup[t] = sym_index | (codesize << 16U);
                        }
                    }
                }
            }

            for (uint32 i = 0; i < cMaxExpectedCodeSize; i++)
                m_val_ptrs[i] -= min_codes[i];

            m_table_max_code = 0;
            m_decode_start_code_size = m_min_code_size;

            if (table_bits)
            {
                uint32 i;
                for (i = table_bits; i >= 1; i--)
                {
                    if (num_codes[i])
                    {
                        m_table_max_code = m_max_codes[i - 1];
                        break;
                    }
                }
                if (i >= 1)
                {
                    m_decode_start_code_size = table_bits + 1;
                    for (uint32 j = table_bits + 1; j <= max_code_size; j++)
                    {
                        if (num_codes[j])
                        {
                            m_decode_start_code_size = j;
                            break;
                        }
                    }
                }
            }

            // sentinels
            m_max_codes[cMaxExpectedCodeSize] = cUINT32_MAX;
            m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

            m_table_shift = 32 - m_table_bits;
            return true;
        }